

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O2

int in_trouble(void)

{
  schar *psVar1;
  schar *psVar2;
  boolean bVar3;
  int iVar4;
  obj *poVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint x;
  int iVar9;
  vptrs *pvVar10;
  int iVar11;
  
  if (u.uprops[0x21].intrinsic == 0) {
    if (u.uprops[0x3a].intrinsic == 0) {
      if (u.uprops[0x22].intrinsic == 0) {
        if ((u.utrap == 0) || (u.utraptype != 3)) {
          if (u.uprops[0x1d].intrinsic == 0) {
            if (u.uhs < 3) {
              if (u.umonnum == u.umonster) {
                if (u.uhp < 6) {
                  return 7;
                }
                if (u.uhp * 7 <= u.uhpmax) {
                  return 7;
                }
              }
              else {
                if (u.mh < 6) {
                  return 7;
                }
                if (u.mh * 7 <= u.mhmax) {
                  return 7;
                }
              }
              if (u.ulycn < 0) {
                iVar4 = near_capacity();
                if ((iVar4 < 4) || ((int)u.amax.a[0] - (int)u.acurr.a[0] < 4)) {
                  iVar4 = 0;
                  for (iVar11 = -1; iVar11 != 2; iVar11 = iVar11 + 1) {
                    for (iVar9 = -1; iVar9 != 2; iVar9 = iVar9 + 1) {
                      if (iVar9 != 0 || iVar11 != 0) {
                        iVar8 = (int)u.ux;
                        if ((iVar8 + iVar11) - 1U < 0x4f) {
                          uVar6 = u.uy + iVar9;
                          if (uVar6 < 0x15) {
                            if ('\x10' < level->locations[(uint)(iVar8 + iVar11)][uVar6].typ) {
                              lVar7 = 0;
                              pvVar10 = (vptrs *)(level->objects[(uint)(iVar8 + iVar11)] + uVar6);
                              while (poVar5 = pvVar10->v_nexthere, poVar5 != (obj *)0x0) {
                                if (poVar5->otyp == 0x214) {
                                  lVar7 = lVar7 + poVar5->quan;
                                }
                                pvVar10 = &poVar5->v;
                              }
                              if (((lVar7 == 0) ||
                                  ((((lVar7 == 1 && ((iVar11 * 2 + iVar8) - 1U < 0x4f)) &&
                                    (uVar6 = (int)u.uy + iVar9 * 2, uVar6 < 0x15)) &&
                                   ((x = iVar8 + iVar11 * 2, '\x10' < level->locations[x][uVar6].typ
                                    && (poVar5 = sobj_at(0x214,level,x,uVar6), poVar5 == (obj *)0x0)
                                    ))))) || (((youmonst.data)->mflags2 & 0x8000000) != 0))
                              goto LAB_002145ef;
                            }
                          }
                        }
                        iVar4 = iVar4 + 1;
                      }
LAB_002145ef:
                    }
                  }
                  if (((iVar4 == 8) && (u.uprops[0x3e].intrinsic == 0)) &&
                     ((u.uprops[0x3e].extrinsic == 0 && (((youmonst.data)->mflags1 & 8) == 0)))) {
                    iVar4 = 4;
                  }
                  else {
                    iVar4 = 3;
                    if ((((uarmf == (obj *)0x0) || (uarmf->otyp != 0x9c)) ||
                        ((uarmf->field_0x4a & 1) == 0)) &&
                       ((poVar5 = stuck_ring(uleft,0xaa), poVar5 == (obj *)0x0 &&
                        (poVar5 = stuck_ring(uright,0xaa), poVar5 == (obj *)0x0)))) {
                      if ((((youmonst.data)->mflags1 & 0x2000) != 0) ||
                         (iVar4 = freehand(), iVar4 == 0)) {
                        iVar4 = welded(uwep);
                        if (iVar4 != 0) {
                          return 2;
                        }
                        if ((u.umonnum != u.umonster) && (((youmonst.data)->mflags1 & 0x2000) != 0))
                        {
                          if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
                            return 2;
                          }
                          poVar5 = unchanger();
                          if ((poVar5 != (obj *)0x0) && ((poVar5->field_0x4a & 1) != 0)) {
                            return 2;
                          }
                        }
                      }
                      if (((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) ||
                         ((ublindf->field_0x4a & 1) == 0)) {
                        if (uball == (obj *)0x0) {
                          iVar4 = -2;
                          if ((((uarmg == (obj *)0x0) || (uarmg->otyp != 0x90)) ||
                              ((uarmg->field_0x4a & 1) == 0)) &&
                             (((uarmf == (obj *)0x0 || (uarmf->otyp != 0x9b)) ||
                              ((uarmf->field_0x4a & 1) == 0)))) {
                            poVar5 = worst_cursed_item();
                            if (poVar5 == (obj *)0x0) {
                              if ((((u.usteed == (monst *)0x0) ||
                                   (poVar5 = which_armor(u.usteed,0x100000), poVar5 == (obj *)0x0))
                                  || (poVar5->otyp != 0xf0)) || ((poVar5->field_0x4a & 1) == 0)) {
                                if ((u.uprops[0x1e].intrinsic < 2) ||
                                   (((youmonst.data)->mflags1 & 0x1000) != 0)) {
                                  iVar4 = -6;
                                  lVar7 = -6;
                                  do {
                                    if (lVar7 == 0) {
                                      if ((u.uprops[0x20].extrinsic != 0 ||
                                           u.uprops[0x20].intrinsic != 0) &&
                                         (u.usteed == (monst *)0x0)) {
                                        return -7;
                                      }
                                      if (1 < u.uhs) {
                                        return -8;
                                      }
                                      if (u.uprops[0x1b].intrinsic == 0) {
                                        if (u.uprops[0x1c].intrinsic != 0) {
                                          return -10;
                                        }
                                        if ((u.uprops[0x23].intrinsic != 0) &&
                                           (u.uprops[0x24].extrinsic == 0)) {
                                          if (u.umonnum == u.umonster) {
                                            return -0xb;
                                          }
                                          bVar3 = dmgtype(youmonst.data,0x24);
                                          if (bVar3 == '\0') {
                                            return -0xb;
                                          }
                                        }
                                        return 0;
                                      }
                                      return -9;
                                    }
                                    psVar1 = u.aexe.a + lVar7;
                                    psVar2 = u.atemp.a + lVar7;
                                    lVar7 = lVar7 + 1;
                                  } while (*psVar2 <= *psVar1);
                                }
                                else {
                                  iVar4 = -5;
                                }
                              }
                              else {
                                iVar4 = -4;
                              }
                            }
                            else {
                              iVar4 = -3;
                            }
                          }
                        }
                        else {
                          iVar4 = -1;
                        }
                      }
                      else {
                        iVar4 = 1;
                      }
                    }
                  }
                }
                else {
                  iVar4 = 5;
                }
              }
              else {
                iVar4 = 6;
              }
            }
            else {
              iVar4 = 8;
            }
          }
          else {
            iVar4 = 9;
          }
        }
        else {
          iVar4 = 10;
        }
      }
      else {
        iVar4 = 0xb;
      }
    }
    else {
      iVar4 = 0xc;
    }
  }
  else {
    iVar4 = 0xd;
  }
  return iVar4;
}

Assistant:

int in_trouble(void)
{
	struct obj *otmp;
	int i, j, count=0;

	/*
	 * major troubles
	 */
	if (Stoned) return TROUBLE_STONED;
	if (Slimed) return TROUBLE_SLIMED;
	if (Strangled) return TROUBLE_STRANGLED;
	if (u.utrap && u.utraptype == TT_LAVA) return TROUBLE_LAVA;
	if (Sick) return TROUBLE_SICK;
	if (u.uhs >= WEAK) return TROUBLE_STARVING;
	if (Upolyd ? (u.mh <= 5 || u.mh*7 <= u.mhmax) :
		(u.uhp <= 5 || u.uhp*7 <= u.uhpmax)) return TROUBLE_HIT;
	if (u.ulycn >= LOW_PM) return TROUBLE_LYCANTHROPE;
	if (near_capacity() >= EXT_ENCUMBER && AMAX(A_STR)-ABASE(A_STR) > 3)
		return TROUBLE_COLLAPSING;

	for (i= -1; i<=1; i++) for (j= -1; j<=1; j++) {
		if (!i && !j) continue;
		if (!isok(u.ux+i, u.uy+j) || IS_ROCK(level->locations[u.ux+i][u.uy+j].typ)
		    || (blocked_boulder(i,j) && !throws_rocks(youmonst.data)))
			count++;
	}
	if (count == 8 && !Passes_walls)
		return TROUBLE_STUCK_IN_WALL;

	if (Cursed_obj(uarmf, LEVITATION_BOOTS) ||
		stuck_ring(uleft, RIN_LEVITATION) ||
		stuck_ring(uright, RIN_LEVITATION))
		return TROUBLE_CURSED_LEVITATION;
	if (nohands(youmonst.data) || !freehand()) {
	    /* for bag/box access [cf use_container()]...
	       make sure it's a case that we know how to handle;
	       otherwise "fix all troubles" would get stuck in a loop */
	    if (welded(uwep)) return TROUBLE_UNUSEABLE_HANDS;
	    if (Upolyd && nohands(youmonst.data) && (!Unchanging ||
		    ((otmp = unchanger()) != 0 && otmp->cursed)))
		return TROUBLE_UNUSEABLE_HANDS;
	}
	if (Blindfolded && ublindf->cursed) return TROUBLE_CURSED_BLINDFOLD;

	/*
	 * minor troubles
	 */
	if (Punished) return TROUBLE_PUNISHED;
	if (Cursed_obj(uarmg, GAUNTLETS_OF_FUMBLING) ||
		Cursed_obj(uarmf, FUMBLE_BOOTS))
	    return TROUBLE_FUMBLING;
	if (worst_cursed_item()) return TROUBLE_CURSED_ITEMS;
	if (u.usteed) {	/* can't voluntarily dismount from a cursed saddle */
	    otmp = which_armor(u.usteed, W_SADDLE);
	    if (Cursed_obj(otmp, SADDLE)) return TROUBLE_SADDLE;
	}

	if (Blinded > 1 && haseyes(youmonst.data)) return TROUBLE_BLIND;
	for (i=0; i<A_MAX; i++)
	    if (ABASE(i) < AMAX(i)) return TROUBLE_POISONED;
	if (Wounded_legs && !u.usteed)
		return TROUBLE_WOUNDED_LEGS;
	if (u.uhs >= HUNGRY) return TROUBLE_HUNGRY;
	if (HStun) return TROUBLE_STUNNED;
	if (HConfusion) return TROUBLE_CONFUSED;
	if (Hallucination) return TROUBLE_HALLUCINATION;
	return 0;
}